

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

StringTree *
capnp::_::structString
          (StringTree *__return_storage_ptr__,StructReader reader,RawBrandedSchema *schema)

{
  Schema local_a8;
  Schema local_a0;
  Reader local_98;
  Reader local_60;
  RawBrandedSchema *local_18;
  RawBrandedSchema *schema_local;
  
  local_18 = schema;
  schema_local = (RawBrandedSchema *)__return_storage_ptr__;
  Schema::Schema(&local_a8,schema);
  local_a0.raw = (RawBrandedSchema *)Schema::asStruct(&local_a8);
  DynamicStruct::Reader::Reader(&local_98,(StructSchema)local_a0.raw,reader);
  DynamicValue::Reader::Reader(&local_60,&local_98);
  anon_unknown_2::stringify(__return_storage_ptr__,&local_60);
  DynamicValue::Reader::~Reader(&local_60);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree structString(StructReader reader, const RawBrandedSchema& schema) {
  return stringify(DynamicStruct::Reader(Schema(&schema).asStruct(), reader));
}